

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

MidiEvent * __thiscall
smf::MidiFile::addMetaEvent
          (MidiFile *this,int aTrack,int aTick,int aType,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *metaData)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  byte *pbVar5;
  MidiEvent *pMVar6;
  uchar auStack_68 [4];
  int lengthsize;
  uchar size [23];
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fulldata;
  int length;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *metaData_local;
  int aType_local;
  int aTick_local;
  int aTrack_local;
  MidiFile *this_local;
  
  this->m_timemapvalid = false;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(metaData);
  fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = (int)sVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  _auStack_68 = 0;
  size[0] = '\0';
  size[1] = '\0';
  size[2] = '\0';
  size[3] = '\0';
  size[4] = '\0';
  size[5] = '\0';
  size[6] = '\0';
  size[7] = '\0';
  size[8] = '\0';
  size[9] = '\0';
  size[10] = '\0';
  size[0xb] = '\0';
  size[0xc] = '\0';
  size[0xd] = '\0';
  size[0xe] = '\0';
  iVar2 = makeVLV(this,auStack_68,
                  (int)fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (long)(iVar2 + 2 +
                   (int)fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage));
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  *pvVar4 = 0xff;
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,1);
  *pbVar5 = (byte)aType & 0x7f;
  for (fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < iVar2;
      fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    vVar1 = local_48[(long)fulldata.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage._4_4_ + -0x20];
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                        (long)(fulldata.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 2));
    *pvVar4 = vVar1;
  }
  for (fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ <
      (int)fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           fulldata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (metaData,(long)fulldata.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                        (long)(iVar2 + 2 +
                              fulldata.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
    *pvVar4 = vVar1;
  }
  pMVar6 = addEvent(this,aTrack,aTick,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return pMVar6;
}

Assistant:

MidiEvent* MidiFile::addMetaEvent(int aTrack, int aTick, int aType,
		std::vector<uchar>& metaData) {
	m_timemapvalid = 0;
	int i;
	int length = (int)metaData.size();
	std::vector<uchar> fulldata;
	uchar size[23] = {0};
	int lengthsize = makeVLV(size, length);

	fulldata.resize(2+lengthsize+length);
	fulldata[0] = 0xff;
	fulldata[1] = aType & 0x7F;
	for (i=0; i<lengthsize; i++) {
		fulldata[2+i] = size[i];
	}
	for (i=0; i<length; i++) {
		fulldata[2+lengthsize+i] = metaData[i];
	}

	return addEvent(aTrack, aTick, fulldata);
}